

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [3])

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  long in_FS_OFFSET;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  Message::Message((Message *)&local_28);
  poVar3 = (ostream *)(local_28.ptr_ + 0x10);
  sVar2 = strlen(*value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,*value,sVar2);
  AppendMessage(this,(Message *)&local_28);
  if (local_28.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = internal::IsTrue(true);
    if ((bVar1) &&
       (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_28.ptr_ + 8))();
    }
    local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }